

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O1

bool __thiscall
Js::JavascriptStringObject::GetSetterBuiltIns
          (JavascriptStringObject *this,PropertyId propertyId,PropertyValueInfo *info,
          DescriptorFlags *descriptorFlags)

{
  if (propertyId == 0xd1) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    *descriptorFlags = Data;
  }
  return propertyId == 0xd1;
}

Assistant:

bool JavascriptStringObject::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* descriptorFlags)
    {
        if (propertyId == PropertyIds::length)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *descriptorFlags = Data;
            return true;
        }

        return false;
    }